

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.cpp
# Opt level: O1

void jsonChildren::reserve2(jsonChildren **mine,json_index_t amount)

{
  jsonChildren *this;
  JSONNode **ppJVar1;
  json_index_t amount_00;
  
  this = *mine;
  if (this->array == (JSONNode **)0x0) {
    this->mycapacity = amount;
    ppJVar1 = (JSONNode **)malloc((ulong)amount << 3);
    this->array = ppJVar1;
  }
  else {
    amount_00 = amount - this->mycapacity;
    if (this->mycapacity <= amount && amount_00 != 0) {
      inc(this,amount_00);
      return;
    }
  }
  return;
}

Assistant:

void jsonChildren::reserve2(jsonChildren *& mine, json_index_t amount) json_nothrow {
    if (mine -> array != 0){
	   if (mine -> mycapacity < amount){
		  mine -> inc(amount - mine -> mycapacity);
		  #ifdef JSON_LESS_MEMORY
			 mine = jsonChildren_Reserved::newChildren_Reserved(mine, amount);
		  #endif
	   }
    } else {
	   mine -> reserve(amount);
    }
}